

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O2

lzma_ret lzma_decoder_init(lzma_lz_decoder_conflict1 *lz,lzma_allocator *allocator,void *options,
                          lzma_lz_options *lz_options)

{
  _Bool _Var1;
  lzma_ret lVar2;
  
  _Var1 = is_lclppb_valid((lzma_options_lzma *)options);
  if (_Var1) {
    lVar2 = lzma_lzma_decoder_create(lz,allocator,options,lz_options);
    if (lVar2 == LZMA_OK) {
      lzma_decoder_reset(lz->coder,options);
      lz->coder->uncompressed_size = 0xffffffffffffffff;
      lVar2 = LZMA_OK;
    }
  }
  else {
    lVar2 = LZMA_PROG_ERROR;
  }
  return lVar2;
}

Assistant:

static lzma_ret
lzma_decoder_init(lzma_lz_decoder *lz, lzma_allocator *allocator,
		const void *options, lzma_lz_options *lz_options)
{
	if (!is_lclppb_valid(options))
		return LZMA_PROG_ERROR;

	return_if_error(lzma_lzma_decoder_create(
			lz, allocator, options, lz_options));

	lzma_decoder_reset(lz->coder, options);
	lzma_decoder_uncompressed(lz->coder, LZMA_VLI_UNKNOWN);

	return LZMA_OK;
}